

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

Message * __thiscall
google::protobuf::internal::GeneratedMessageReflection::ReleaseLast
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Type TVar2;
  uint32 uVar3;
  MessageLite *pMVar4;
  MapFieldBase *this_00;
  Type *pTVar5;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseLast","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) != 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseLast",
               "Field is singular; the method requires a repeated field.");
  }
  TVar2 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseLast",CPPTYPE_MESSAGE);
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar3 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar4 = ExtensionSet::ReleaseLast
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                        *(int *)(field + 0x38));
    return (Message *)pMVar4;
  }
  bVar1 = FieldDescriptor::is_map(field);
  uVar3 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  this_00 = (MapFieldBase *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
  if (bVar1) {
    this_00 = (MapFieldBase *)MapFieldBase::MutableRepeatedField(this_00);
  }
  pTVar5 = RepeatedPtrFieldBase::
           ReleaseLastInternal<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                     ((RepeatedPtrFieldBase *)this_00);
  return pTVar5;
}

Assistant:

Message* GeneratedMessageReflection::ReleaseLast(
    Message* message,
    const FieldDescriptor* field) const {
  USAGE_CHECK_ALL(ReleaseLast, REPEATED, MESSAGE);

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->ReleaseLast(field->number()));
  } else {
    if (IsMapFieldInApi(field)) {
      return MutableRaw<MapFieldBase>(message, field)
          ->MutableRepeatedField()
          ->ReleaseLast<GenericTypeHandler<Message> >();
    } else {
      return MutableRaw<RepeatedPtrFieldBase>(message, field)
        ->ReleaseLast<GenericTypeHandler<Message> >();
    }
  }
}